

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pricing_session.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::PricingSession::OnSubscriptionStatus
          (PricingSession *this,Subject *subject,SubscriptionStatus status,string *reason)

{
  pointer pfVar1;
  iterator iVar2;
  pointer __x;
  SubscriptionStatus status_local;
  shared_ptr<bidfx_public_api::SubscriptionStatusEvent> event;
  __shared_ptr<bidfx_public_api::SubscriptionStatusEvent,_(__gnu_cxx::_Lock_policy)2> local_60;
  function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)> callback;
  
  if (((this->running_)._M_base._M_i & 1U) != 0) {
    status_local = status;
    iVar2 = std::
            _Rb_tree<bidfx_public_api::price::subject::Subject,_std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::Subscription>,_std::_Select1st<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::Subscription>_>,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::Subscription>_>_>
            ::find(&(this->subscriptions_)._M_t,subject);
    if ((_Rb_tree_header *)iVar2._M_node !=
        &(this->subscriptions_)._M_t._M_impl.super__Rb_tree_header) {
      Subscription::SetStatus((Subscription *)&iVar2._M_node[1]._M_right,status_local);
      Subscription::ClearPriceFields((Subscription *)&iVar2._M_node[1]._M_right);
    }
    std::
    make_shared<bidfx_public_api::SubscriptionStatusEvent,bidfx_public_api::price::subject::Subject_const&,bidfx_public_api::SubscriptionStatus&,std::__cxx11::string&>
              ((Subject *)
               &event.
                super___shared_ptr<bidfx_public_api::SubscriptionStatusEvent,_(__gnu_cxx::_Lock_policy)2>
               ,(SubscriptionStatus *)subject,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&status_local);
    pfVar1 = (this->subscription_status_callback_).
             super__Vector_base<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__x = (this->subscription_status_callback_).
               super__Vector_base<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __x != pfVar1; __x = __x + 1) {
      std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>::function
                (&callback,__x);
      std::__shared_ptr<bidfx_public_api::SubscriptionStatusEvent,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_60,
                   &event.
                    super___shared_ptr<bidfx_public_api::SubscriptionStatusEvent,_(__gnu_cxx::_Lock_policy)2>
                  );
      std::function<void_(std::shared_ptr<bidfx_public_api::SubscriptionStatusEvent>)>::operator()
                (&callback,(shared_ptr<bidfx_public_api::SubscriptionStatusEvent> *)&local_60);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
      std::_Function_base::~_Function_base(&callback.super__Function_base);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&event.
                super___shared_ptr<bidfx_public_api::SubscriptionStatusEvent,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  return;
}

Assistant:

void PricingSession::OnSubscriptionStatus(const Subject& subject, SubscriptionStatus status, std::string reason)
{
    if (!running_)
    {
        return;
    }
    auto subscription_it = subscriptions_.find(subject);
    if (subscription_it != subscriptions_.end())
    {
        subscription_it->second.SetStatus(status);
        subscription_it->second.ClearPriceFields();
    }

    std::shared_ptr<SubscriptionStatusEvent> event = std::make_shared<SubscriptionStatusEvent>(subject, status, reason);
    try
    {
        for (auto callback : subscription_status_callback_)
        {
            callback(event);
        }
    }
    catch (std::exception &e)
    {
        Log->warn("error handling price status {}", e.what());
        throw e;
    }
}